

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

void parse_rockridge_SL1(file_info *file,uchar *data,int data_length)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  uchar *_p;
  uchar nlen;
  char *pcStack_28;
  uchar flag;
  char *separator;
  uchar *puStack_18;
  int data_length_local;
  uchar *data_local;
  file_info *file_local;
  
  pcStack_28 = "";
  if ((file->symlink_continues == '\0') || ((file->symlink).length == 0)) {
    (file->symlink).length = 0;
  }
  file->symlink_continues = '\0';
  if (0 < data_length) {
    if (*data != '\0') {
      if (*data != '\x01') {
        return;
      }
      file->symlink_continues = '\x01';
    }
    puStack_18 = data + 1;
    separator._4_4_ = data_length + -1;
    while (1 < separator._4_4_) {
      uVar1 = *puStack_18;
      _p = puStack_18 + 2;
      bVar2 = puStack_18[1];
      iVar3 = separator._4_4_ + -2;
      archive_strcat(&file->symlink,pcStack_28);
      pcStack_28 = "/";
      switch(uVar1) {
      case '\0':
        if (iVar3 < (int)(uint)bVar2) {
          return;
        }
        archive_strncat(&file->symlink,_p,(ulong)bVar2);
        break;
      case '\x01':
        if (iVar3 < (int)(uint)bVar2) {
          return;
        }
        archive_strncat(&file->symlink,_p,(ulong)bVar2);
        pcStack_28 = "";
        break;
      case '\x02':
        archive_strcat(&file->symlink,".");
        break;
      default:
        return;
      case '\x04':
        archive_strcat(&file->symlink,"..");
        break;
      case '\b':
        archive_strcat(&file->symlink,"/");
        pcStack_28 = "";
        break;
      case '\x10':
        (file->symlink).length = 0;
        archive_strcat(&file->symlink,"ROOT");
        break;
      case ' ':
        archive_strcat(&file->symlink,"hostname");
      }
      puStack_18 = _p + (int)(uint)bVar2;
      separator._4_4_ = iVar3 - (uint)bVar2;
    }
  }
  return;
}

Assistant:

static void
parse_rockridge_SL1(struct file_info *file, const unsigned char *data,
    int data_length)
{
	const char *separator = "";

	if (!file->symlink_continues || file->symlink.length < 1)
		archive_string_empty(&file->symlink);
	file->symlink_continues = 0;

	/*
	 * Defined flag values:
	 *  0: This is the last SL record for this symbolic link
	 *  1: this symbolic link field continues in next SL entry
	 *  All other values are reserved.
	 */
	if (data_length < 1)
		return;
	switch(*data) {
	case 0:
		break;
	case 1:
		file->symlink_continues = 1;
		break;
	default:
		return;
	}
	++data;  /* Skip flag byte. */
	--data_length;

	/*
	 * SL extension body stores "components".
	 * Basically, this is a complicated way of storing
	 * a POSIX path.  It also interferes with using
	 * symlinks for storing non-path data. <sigh>
	 *
	 * Each component is 2 bytes (flag and length)
	 * possibly followed by name data.
	 */
	while (data_length >= 2) {
		unsigned char flag = *data++;
		unsigned char nlen = *data++;
		data_length -= 2;

		archive_strcat(&file->symlink, separator);
		separator = "/";

		switch(flag) {
		case 0: /* Usual case, this is text. */
			if (data_length < nlen)
				return;
			archive_strncat(&file->symlink,
			    (const char *)data, nlen);
			break;
		case 0x01: /* Text continues in next component. */
			if (data_length < nlen)
				return;
			archive_strncat(&file->symlink,
			    (const char *)data, nlen);
			separator = "";
			break;
		case 0x02: /* Current dir. */
			archive_strcat(&file->symlink, ".");
			break;
		case 0x04: /* Parent dir. */
			archive_strcat(&file->symlink, "..");
			break;
		case 0x08: /* Root of filesystem. */
			archive_strcat(&file->symlink, "/");
			separator = "";
			break;
		case 0x10: /* Undefined (historically "volume root" */
			archive_string_empty(&file->symlink);
			archive_strcat(&file->symlink, "ROOT");
			break;
		case 0x20: /* Undefined (historically "hostname") */
			archive_strcat(&file->symlink, "hostname");
			break;
		default:
			/* TODO: issue a warning ? */
			return;
		}
		data += nlen;
		data_length -= nlen;
	}
}